

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O2

void __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this)

{
  Vertex *this_00;
  __node_base *p_Var1;
  
  p_Var1 = &(this->vertex_map_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = *(Vertex **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor;
    if (this_00 != (Vertex *)0x0) {
      Vertex::~Vertex(this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->vertex_map_)._M_h);
  return;
}

Assistant:

Graph<State, Transition, StateIndexer>::~Graph() {
  for (auto &vertex_pair : vertex_map_) {
    delete vertex_pair.second;
  }
}